

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

ssize_t readn(int fd,void *buff,size_t n)

{
  long lVar1;
  int *piVar2;
  size_t nleft;
  char *ptr;
  ssize_t sVar3;
  
  if (n == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      lVar1 = read(fd,buff,n);
      if (lVar1 < 0) {
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          if (*piVar2 == 0xb) {
            return sVar3;
          }
          return -1;
        }
        lVar1 = 0;
      }
      else if (lVar1 == 0) {
        return sVar3;
      }
      sVar3 = sVar3 + lVar1;
      buff = (void *)((long)buff + lVar1);
      n = n - lVar1;
    } while (n != 0);
  }
  return sVar3;
}

Assistant:

ssize_t readn(int fd, void *buff, size_t n) {
  size_t nleft = n;
  ssize_t nread = 0;
  ssize_t readSum = 0;
  char *ptr = (char *)buff;
  while (nleft > 0) {
    if ((nread = read(fd, ptr, nleft)) < 0) {
      if (errno == EINTR)
        nread = 0;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        return -1;
      }
    } else if (nread == 0)
      break;
    readSum += nread;
    nleft -= nread;
    ptr += nread;
  }
  return readSum;
}